

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O2

cbtVector3 ThreePlaneIntersection(cbtPlane *p0,cbtPlane *p1,cbtPlane *p2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 in_XMM1_Qb;
  undefined1 auVar8 [16];
  float fVar9;
  cbtVector3 cVar10;
  cbtVector3 cVar11;
  cbtVector3 cVar12;
  cbtVector3 N3;
  cbtVector3 N2;
  cbtVector3 N1;
  float local_88;
  float local_78;
  float fStack_74;
  cbtVector3 local_68;
  cbtVector3 local_58;
  cbtVector3 local_48;
  
  local_48.m_floats._0_8_ = *(undefined8 *)(p0->normal).m_floats;
  local_48.m_floats._8_8_ = *(undefined8 *)((p0->normal).m_floats + 2);
  local_58.m_floats._0_8_ = *(undefined8 *)(p1->normal).m_floats;
  local_58.m_floats._8_8_ = *(undefined8 *)((p1->normal).m_floats + 2);
  local_68.m_floats._0_8_ = *(undefined8 *)(p2->normal).m_floats;
  uVar7 = *(undefined8 *)((p2->normal).m_floats + 2);
  local_68.m_floats._8_8_ = uVar7;
  cVar10 = cbtVector3::cross(&local_58,&local_68);
  cVar11 = cbtVector3::cross(&local_68,&local_48);
  cVar12 = cbtVector3::cross(&local_48,&local_58);
  auVar5._8_4_ = (cbtScalar)uVar7;
  auVar5._12_4_ = SUB84(uVar7,4);
  auVar5._0_8_ = cVar10.m_floats._0_8_;
  auVar6._8_8_ = in_XMM1_Qb;
  auVar6._0_8_ = cVar10.m_floats._8_8_;
  fVar1 = p0->dist;
  auVar4 = vmovshdup_avx(auVar5);
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(auVar4._0_4_ * local_48.m_floats[1])),auVar5,
                           ZEXT416((uint)local_48.m_floats[0]));
  auVar4 = vfmadd231ss_fma(auVar4,auVar6,ZEXT416((uint)local_48.m_floats[2]));
  fVar9 = -1.0 / auVar4._0_4_;
  fVar2 = p1->dist;
  local_88 = cVar11.m_floats[2];
  local_78 = cVar11.m_floats[0];
  fStack_74 = cVar11.m_floats[1];
  fVar3 = p2->dist;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = SUB608(ZEXT1260((undefined1  [12])0x0),4);
  auVar8._4_12_ = SUB1612(auVar4 << 0x40,4);
  auVar8._0_4_ = fVar9 * (cVar12.m_floats[2] * fVar3 + cVar10.m_floats[2] * fVar1 + fVar2 * local_88
                         );
  cVar11.m_floats[0] =
       fVar9 * (cVar12.m_floats[0] * fVar3 + cVar10.m_floats[0] * fVar1 + fVar2 * local_78);
  cVar11.m_floats[1] =
       fVar9 * (cVar12.m_floats[1] * fVar3 + cVar10.m_floats[1] * fVar1 + fVar2 * fStack_74);
  cVar11.m_floats._8_8_ = auVar8._0_8_;
  return (cbtVector3)cVar11.m_floats;
}

Assistant:

cbtVector3 ThreePlaneIntersection(const cbtPlane &p0, const cbtPlane &p1, const cbtPlane &p2)
{
	cbtVector3 N1 = p0.normal;
	cbtVector3 N2 = p1.normal;
	cbtVector3 N3 = p2.normal;

	cbtVector3 n2n3;
	n2n3 = N2.cross(N3);
	cbtVector3 n3n1;
	n3n1 = N3.cross(N1);
	cbtVector3 n1n2;
	n1n2 = N1.cross(N2);

	cbtScalar quotient = (N1.dot(n2n3));

	cbtAssert(cbtFabs(quotient) > cbtScalar(0.000001));

	quotient = cbtScalar(-1.) / quotient;
	n2n3 *= p0.dist;
	n3n1 *= p1.dist;
	n1n2 *= p2.dist;
	cbtVector3 potentialVertex = n2n3;
	potentialVertex += n3n1;
	potentialVertex += n1n2;
	potentialVertex *= quotient;

	cbtVector3 result(potentialVertex.getX(), potentialVertex.getY(), potentialVertex.getZ());
	return result;
}